

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

GLuint __thiscall vera::Shader::compileShader(Shader *this,string *_src,GLenum _type,bool _verbose)

{
  bool bVar1;
  GLuint GVar2;
  uint uVar3;
  istream *piVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  long lVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  _Self __tmp;
  allocator local_5e2;
  allocator local_5e1;
  GLint infoLength;
  GLint isCompiled;
  string srcVersion;
  string dataRead;
  size_t glslVersionNumber;
  ulong local_570;
  string *local_568;
  string *local_560;
  string prolog;
  GLchar *sources [2];
  string srcBody;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  chuncks;
  string local_4e8;
  string local_4c8;
  istringstream versionIss;
  ostringstream srcOss;
  istringstream srcIss;
  
  std::__cxx11::string::string((string *)&prolog,"",(allocator *)&srcIss);
  srcBody._M_dataplus._M_p = (pointer)&srcBody.field_2;
  srcBody._M_string_length = 0;
  srcBody.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::substr((ulong)&srcIss,(ulong)_src);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &srcIss,"#version");
  std::__cxx11::string::~string((string *)&srcIss);
  if (bVar1) {
    std::__cxx11::istringstream::istringstream((istringstream *)&srcIss,(string *)_src,_S_in);
    srcVersion._M_dataplus._M_p = (pointer)&srcVersion.field_2;
    srcVersion._M_string_length = 0;
    srcVersion.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&srcIss,(string *)&srcVersion);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&versionIss,
                   &srcVersion,'\n');
    std::__cxx11::string::append((string *)&prolog);
    std::__cxx11::string::~string((string *)&versionIss);
    std::__cxx11::string::string((string *)&versionIss,"",(allocator *)&dataRead);
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)&srcOss,(string *)&versionIss,_S_out);
    std::__cxx11::string::~string((string *)&versionIss);
    dataRead._M_dataplus._M_p = (pointer)&dataRead.field_2;
    dataRead._M_string_length = 0;
    dataRead.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&srcIss,(string *)&dataRead);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      poVar5 = std::operator<<((ostream *)&srcOss,(string *)&dataRead);
      std::operator<<(poVar5,'\n');
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&srcBody,(string *)&versionIss);
    std::__cxx11::string::~string((string *)&versionIss);
    glslVersionNumber = 0;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&versionIss,(string *)&srcVersion,_S_in);
    std::operator>>((istream *)&versionIss,(string *)&dataRead);
    std::istream::_M_extract<unsigned_long>((ulong *)&versionIss);
    uVar11 = (ulong)(glslVersionNumber - 0x97 < 0xffffffffffffffd7);
    std::__cxx11::istringstream::~istringstream((istringstream *)&versionIss);
    std::__cxx11::string::~string((string *)&dataRead);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&srcOss);
    std::__cxx11::string::~string((string *)&srcVersion);
    std::__cxx11::istringstream::~istringstream((istringstream *)&srcIss);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&srcBody);
    uVar11 = 0;
  }
  if ((this->super_HaveDefines).m_defineChange == true) {
    local_560 = (string *)&this->m_defineStack;
    std::__cxx11::string::assign((char *)local_560);
    local_570 = uVar11;
    local_568 = _src;
    for (p_Var6 = (this->super_HaveDefines).m_defines._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(this->super_HaveDefines).m_defines._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      std::operator+(&srcVersion,"#define ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var6 + 1));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcOss,
                     &srcVersion," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &versionIss,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcOss,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var6 + 2));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcIss,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &versionIss,'\n');
      std::__cxx11::string::append(local_560);
      std::__cxx11::string::~string((string *)&srcIss);
      std::__cxx11::string::~string((string *)&versionIss);
      std::__cxx11::string::~string((string *)&srcOss);
      std::__cxx11::string::~string((string *)&srcVersion);
    }
    (this->super_HaveDefines).m_defineChange = false;
    _src = local_568;
    uVar11 = local_570;
  }
  std::__cxx11::string::append((string *)&prolog);
  std::__cxx11::to_string((string *)&srcOss,uVar11 + bVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&versionIss,
                 "#line ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &srcOss);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcIss,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&versionIss,
                 "\n");
  std::__cxx11::string::append((string *)&prolog);
  std::__cxx11::string::~string((string *)&srcIss);
  std::__cxx11::string::~string((string *)&versionIss);
  std::__cxx11::string::~string((string *)&srcOss);
  sources[0] = prolog._M_dataplus._M_p;
  sources[1] = srcBody._M_dataplus._M_p;
  GVar2 = glCreateShader(_type);
  glShaderSource(GVar2,2,sources,0);
  glCompileShader(GVar2);
  glGetShaderiv(GVar2,0x8b81,&isCompiled);
  infoLength = 0;
  glGetShaderiv(GVar2,0x8b84);
  if (1 < (long)infoLength) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&glslVersionNumber,(long)infoLength,
               (allocator_type *)&srcIss);
    glGetShaderInfoLog(GVar2,infoLength,0,glslVersionNumber);
    poVar5 = std::operator<<((ostream *)&std::cerr,"Found ");
    pcVar10 = "warning ";
    if (isCompiled == 0) {
      pcVar10 = "error";
    }
    poVar5 = std::operator<<(poVar5,pcVar10);
    poVar5 = std::operator<<(poVar5," while compiling ");
    pcVar10 = "vertex";
    if (_type == 0x8b30) {
      pcVar10 = "fragment";
    }
    poVar5 = std::operator<<(poVar5,pcVar10);
    poVar5 = std::operator<<(poVar5," shader");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::string
              ((string *)&srcIss,(char *)glslVersionNumber,(allocator *)&versionIss);
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&srcIss);
    std::endl<char,std::char_traits<char>>(poVar5);
    split(&chuncks,(string *)&srcIss,' ',false);
    std::__cxx11::string::string
              ((string *)&local_4c8,
               (string *)
               chuncks.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::string((string *)&srcOss,"(",(allocator *)&dataRead);
    std::__cxx11::string::string((string *)&srcVersion,":",&local_5e2);
    replaceAll((string *)&versionIss,&local_4c8,(string *)&srcOss,&srcVersion);
    std::__cxx11::string::~string((string *)&srcVersion);
    std::__cxx11::string::~string((string *)&srcOss);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::string((string *)&local_4e8,(string *)&versionIss);
    std::__cxx11::string::string((string *)&srcVersion,")",&local_5e2);
    std::__cxx11::string::string((string *)&dataRead,":",&local_5e1);
    replaceAll((string *)&srcOss,&local_4e8,&srcVersion,&dataRead);
    std::__cxx11::string::operator=((string *)&versionIss,(string *)&srcOss);
    std::__cxx11::string::~string((string *)&srcOss);
    std::__cxx11::string::~string((string *)&dataRead);
    std::__cxx11::string::~string((string *)&srcVersion);
    std::__cxx11::string::~string((string *)&local_4e8);
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&srcOss,(string *)&versionIss,':',false);
    bVar1 = isInt((string *)(_srcOss + 0x20));
    if (bVar1) {
      uVar3 = toInt((string *)(_srcOss + 0x20));
      if (1 < uVar3) {
        split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&srcVersion,_src,'\n',true);
        lVar7 = (long)(int)uVar3;
        lVar9 = lVar7 * 0x20 + -0x40;
        for (lVar8 = lVar7 + -1;
            (lVar8 - 1U <
             (ulong)((long)(srcVersion._M_string_length - (long)srcVersion._M_dataplus._M_p) >> 5)
            && (lVar8 - 1U < lVar7 + 1U)); lVar8 = lVar8 + 1) {
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,(string *)(srcVersion._M_dataplus._M_p + lVar9));
          lVar9 = lVar9 + 0x20;
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&srcVersion);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&srcOss);
    std::__cxx11::string::~string((string *)&versionIss);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&chuncks);
    std::__cxx11::string::~string((string *)&srcIss);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&glslVersionNumber);
  }
  if (isCompiled == 0) {
    glDeleteShader(GVar2);
    GVar2 = 0;
  }
  std::__cxx11::string::~string((string *)&srcBody);
  std::__cxx11::string::~string((string *)&prolog);
  return GVar2;
}

Assistant:

GLuint Shader::compileShader(const std::string& _src, GLenum _type, bool _verbose) {
    std::string prolog = "";

    //
    // detect #version directive at the beginning of the shader, move it to the prolog and remove it from the shader
    //

    std::string srcBody; // _src stripped of any #version directive at the beginning
    bool zeroBasedLineDirective; // true for GLSL core 1.10 to 1.50
    bool srcVersionFound = _src.substr(0, 8) == "#version"; // true if user provided a #version directive at the beginning of _src

    if (srcVersionFound) {
        //
        // split _src into srcVersion and srcBody
        //

        std::istringstream srcIss(_src);

        // the version line can be read without checking the result of getline(), srcVersionFound == true implies this
        std::string srcVersion;
        std::getline(srcIss,srcVersion);

        // move the #version directive to the top of the prolog
        prolog += srcVersion + '\n';

        // copy the rest of the shader into srcBody
        std::ostringstream srcOss("");
        std::string dataRead;
        while (std::getline(srcIss,dataRead)) {
            srcOss << dataRead << '\n';
        }
        srcBody = srcOss.str();

        //
        // try to determine which version are we actually using
        //

        size_t glslVersionNumber = 0;
        std::istringstream versionIss(srcVersion);
        versionIss >> dataRead; // consume the "#version" string which is guaranteed to be there
        versionIss >> glslVersionNumber; // try to read the next token and convert it to a number

        //
        // determine if the glsl version number starts numbering the #line directive from 0 or from 1
        //
        // #version 100        : "es"   profile, numbering starts from 1
        // #version 110 to 150 : "core" profile, numbering starts from 0
        // #version 200        : "es"   profile, numbering starts from 1
        // #version 300 to 320 : "es"   profile, numbering starts from 1
        // #version 330+       : all           , numbering starts from 1
        //
        // Any malformed or invalid #version directives are of no interest here, the shader compiler
        // will take care of reporting this to the user later.
        //

        zeroBasedLineDirective = (glslVersionNumber >= 110 && glslVersionNumber <= 150);

    } else {
        // no #version directive found at the beginning of _src, which means...
        srcBody = _src; // ... _src contains the whole shader body and ...
        zeroBasedLineDirective = true; // ... glsl defaults to version 1.10, which starts numbering #line directives from 0.
    }

    // Only update the define stack string when it change
    if (m_defineChange) {
        m_defineStack = "";
        for (DefinesMap_it it = m_defines.begin(); it != m_defines.end(); it++)
            m_defineStack += "#define " + it->first + " " + it->second + '\n';
        m_defineChange = false;
    }
    prolog += m_defineStack;

    //
    // determine the #line offset to be used for conciliating lines in glsl error messages and the line number in the editor
    //
    // #line 0 : no version specified by user, glsl defaults to version 1.10, shader source used without modifications
    // #line 1 : user specified #version 1.10 to 1.50, which start numbering #line from 0, version line removed from _src
    // #line 2 : user specified a version #version other than 1.10 to 1.50, those start numbering #line from 1, version line removed from _src
    //

    size_t startLine = (srcVersionFound ? 1 : 0) + (zeroBasedLineDirective ? 0 : 1);
    prolog += "#line " + std::to_string(startLine) + "\n";

    // if (_verbose) {
    //     if (_type == GL_VERTEX_SHADER) {
    //         std::cout << "// ---------- Vertex Shader" << std::endl;
    //     }
    //     else {
    //         std::cout << "// ---------- Fragment Shader" << std::endl;
    //     }
    //     std::cout << prolog << std::endl;
    //     std::cout << srcBody << std::endl;
    // }

    const GLchar* sources[2] = {
        (const GLchar*) prolog.c_str(),
        (const GLchar*) srcBody.c_str()
    };

    GLuint shader = glCreateShader(_type);
    glShaderSource(shader, 2, sources, NULL);
    glCompileShader(shader);

    GLint isCompiled;
    glGetShaderiv(shader, GL_COMPILE_STATUS, &isCompiled);

    GLint infoLength = 0;
    glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLength);

#if defined(PLATFORM_RPI) || defined(__EMSCRIPTEN__)
    if (infoLength > 1 && !isCompiled) {
#else
    if (infoLength > 1) {
#endif
        std::vector<GLchar> infoLog(infoLength);
        glGetShaderInfoLog(shader, infoLength, NULL, &infoLog[0]);
        std::cerr << "Found " << (isCompiled ? "warning " : "error") << " while compiling " << ((_type == GL_FRAGMENT_SHADER)? "fragment" : "vertex") << " shader" << std::endl;
        std::string error_msg = &infoLog[0];
        std::cerr << error_msg << std::endl;

        std::vector<std::string> chuncks = vera::split(error_msg, ' ');
        size_t line_number = 0;

#if defined(__APPLE__)
    // Error Message on Apple M1
        // ERROR: 0:41: 'color' : syntax error: syntax error

        std::vector<std::string> error_loc = vera::split(chuncks[1], ':');
        if (vera::isInt(error_loc[1]))
            line_number = vera::toInt(error_loc[1]);

#elif defined(_WIN32)

#elif defined(__EMSCRIPTEN__)

#else
    // Linux ARM
        // 0:41(2): error: syntax error, unexpected IDENTIFIER, expecting ',' or ';'

    // Linux iX86
        // Error Message on Mesa Intel(R) Iris(R) Plus Graohics (ICL GT2)
        // 0:41(2): error: syntax error, unexpected IDENTIFIER, expecting ',' or ';'

        // Error Message on NVdia GeForce GTX 1650
        // 0(41) : error C0000: syntax error, unexpected '.', expecting "::" at token "."

        std::string error_loc1 = vera::replaceAll(chuncks[0], "(", ":");
        error_loc1 = vera::replaceAll(error_loc1, ")", ":");
        std::vector<std::string> error_loc2 = vera::split(error_loc1, ':');
        if (vera::isInt(error_loc2[1]))
            line_number = vera::toInt(error_loc2[1]);

#endif

        // Print line (-/+ lines for context)
        if (line_number > 1) {
            line_number -= 2;
            std::vector<std::string> lines = vera::split(_src, '\n', true);
            for (size_t i = line_number; i < lines.size() && i < line_number + 3; i++)
                std::cerr << i + 1 << " " << lines[i] << std::endl;
        }

    }

    if (isCompiled == GL_FALSE) {
        glDeleteShader(shader);
        return 0;
    }

    return shader;
}

void Shader::detach(GLenum _type) {
#ifndef __EMSCRIPTEN__
    bool vert = (GL_VERTEX_SHADER & _type) == GL_VERTEX_SHADER;
    bool frag = (GL_FRAGMENT_SHADER & _type) == GL_FRAGMENT_SHADER;

    if (vert) {
        glDeleteShader(m_vertexShader);
        glDetachShader(m_vertexShader, GL_VERTEX_SHADER);
    }

    if (frag) {
        glDeleteShader(m_fragmentShader);
        glDetachShader(m_fragmentShader, GL_FRAGMENT_SHADER);
    }
#endif
}

GLint Shader::getUniformLocation(const std::string& _uniformName) const {
    GLint loc = glGetUniformLocation(m_program, _uniformName.c_str());
    if (loc == -1){
        // std::cerr << "Uniform " << _uniformName << " not found" << std::endl;
    }
    return loc;
}

void Shader::setUniform(const std::string& _name, int _x) {
    if (inUse()) {
        glUniform1i(getUniformLocation(_name), _x);
    }
}

void Shader::setUniform(const std::string& _name, int _x, int _y) {
    if (inUse()) {
        glUniform2i(getUniformLocation(_name), _x, _y);
        // std::cout << "Uniform " << _name << ": vec2i(" << _x << "," << _y << ")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, int _x, int _y, int _z) {
    if (inUse()) {
        glUniform3i(getUniformLocation(_name), _x, _y, _z);
        // std::cout << "Uniform " << _name << ": vec3i(" << _x << "," << _y << "," << _z <<")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, int _x, int _y, int _z, int _w) {
    if (inUse()) {
        glUniform4i(getUniformLocation(_name), _x, _y, _z, _w);
        // std::cout << "Uniform " << _name << ": vec4i(" << _x << "," << _y << "," << _z << << "," << _w << ")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, const int *_array, size_t _size) {
    GLint loc = getUniformLocation(_name);
    if (inUse()) {
        if (_size == 1) {
            glUniform1i(loc, _array[0]);
        }
        else if (_size == 2) {
            glUniform2i(loc, _array[0], _array[1]);
            std::cout << _name << ',' << _array[0] << ',' << _array[1] << std::endl;
        }
        else if (_size == 3) {
            glUniform3i(loc, _array[0], _array[1], _array[2]);
        }
        else if (_size == 4) {
            glUniform4i(loc, _array[0], _array[1], _array[2], _array[3]);
        }
        else {
            std::cerr << "Passing matrix uniform as array, not supported yet" << std::endl;
        }
    }
}

void Shader::setUniform(const std::string& _name, float _x) {
    if (inUse()) {
        glUniform1f(getUniformLocation(_name), _x);
        // std::cout << "Uniform " << _name << ": float(" << _x << ")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, float _x, float _y) {
    if (inUse()) {
        glUniform2f(getUniformLocation(_name), _x, _y);
        // std::cout << "Uniform " << _name << ": vec2(" << _x << "," << _y << ")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, float _x, float _y, float _z) {
    if (inUse()) {
        glUniform3f(getUniformLocation(_name), _x, _y, _z);
        // std::cout << "Uniform " << _name << ": vec3(" << _x << "," << _y << "," << _z <<")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, float _x, float _y, float _z, float _w) {
    if (inUse()) {
        glUniform4f(getUniformLocation(_name), _x, _y, _z, _w);
        // std::cout << "Uniform " << _name << ": vec3(" << _x << "," << _y << "," << _z <<")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, const float *_array, size_t _size) {
    GLint loc = getUniformLocation(_name);
    if (inUse()) {
        if (_size == 1) {
            glUniform1f(loc, _array[0]);
        }
        else if (_size == 2) {
            glUniform2f(loc, _array[0], _array[1]);
        }
        else if (_size == 3) {
            glUniform3f(loc, _array[0], _array[1], _array[2]);
        }
        else if (_size == 4) {
            glUniform4f(loc, _array[0], _array[1], _array[2], _array[2]);
        }
        else {
            std::cerr << "Passing matrix uniform as array, not supported yet" << std::endl;
        }
    }
}

void Shader::setUniform(const std::string& _name, const glm::vec2 *_array, size_t _size) {
    if (inUse()) {
        glUniform2fv(getUniformLocation(_name), _size, glm::value_ptr(_array[0]));
    }
}

void Shader::setUniform(const std::string& _name, const glm::vec3 *_array, size_t _size) {
    if (inUse()) {
        glUniform3fv(getUniformLocation(_name), _size, glm::value_ptr(_array[0]));
    }
}

void Shader::setUniform(const std::string& _name, const glm::vec4 *_array, size_t _size) {
    if (inUse()) {
        glUniform4fv(getUniformLocation(_name), _size, glm::value_ptr(_array[0]));
    }
}

void Shader::setUniformTexture(const std::string& _name, GLuint _textureId, size_t _texLoc) {
    if (inUse()) {
        glActiveTexture(GL_TEXTURE0 + _texLoc);
        glBindTexture(GL_TEXTURE_2D, _textureId);
        glUniform1i(getUniformLocation(_name), _texLoc);
    }
}

void Shader::setUniformTexture(const std::string& _name, const Texture* _tex, size_t _texLoc) {
    setUniformTexture(_name, _tex->getTextureId(), _texLoc);
}

void Shader::setUniformTexture(const std::string& _name, const Fbo* _fbo, size_t _texLoc) {
    setUniformTexture(_name, _fbo->getTextureId(), _texLoc);
}

void Shader::setUniformDepthTexture(const std::string& _name, const Fbo* _fbo, size_t _texLoc) {
    setUniformTexture(_name, _fbo->getDepthTextureId(), _texLoc);
}

void Shader::setUniformTexture(const std::string& _name, const Texture* _tex) {
    setUniformTexture(_name, _tex->getTextureId(), textureIndex++);
}

void  Shader::setUniformTexture(const std::string& _name, const Fbo* _fbo) {
    setUniformTexture(_name, _fbo->getTextureId(), textureIndex++);
}

void  Shader::setUniformDepthTexture(const std::string& _name, const Fbo* _fbo) {
    setUniformTexture(_name, _fbo->getDepthTextureId(), textureIndex++);
}

void Shader::setUniformTextureCube(const std::string& _name, const TextureCube* _tex, size_t _texLoc) {
    if (inUse()) {
        glActiveTexture(GL_TEXTURE0 + _texLoc);
        glBindTexture(GL_TEXTURE_CUBE_MAP, _tex->getTextureId());
        glUniform1i(getUniformLocation(_name), _texLoc);
    }
}

void  Shader::setUniformTextureCube(const std::string& _name, const TextureCube* _tex) {
    setUniformTextureCube(_name, _tex, textureIndex++);
}

void Shader::setUniform(const std::string& _name, const glm::mat2& _value, bool _transpose) {
    if (inUse()) {
        glUniformMatrix2fv(getUniformLocation(_name), 1, _transpose, &_value[0][0]);
    }
}

void Shader::setUniform(const std::string& _name, const glm::mat3& _value, bool _transpose) {
    if (inUse()) {
        glUniformMatrix3fv(getUniformLocation(_name), 1, _transpose, &_value[0][0]);
    }
}

void Shader::setUniform(const std::string& _name, const glm::mat4& _value, bool _transpose) {
    if (inUse()) {
        glUniformMatrix4fv(getUniformLocation(_name), 1, _transpose, &_value[0][0]);
    }
}

}